

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O0

Cdr * __thiscall
eprosima::fastcdr::Cdr::serializeArray(Cdr *this,int32_t *long_t,size_t numElements)

{
  bool bVar1;
  size_t sVar2;
  NotEnoughMemoryException *this_00;
  long in_RDX;
  Cdr *in_RDI;
  char *end;
  char *dst;
  size_t sizeAligned;
  size_t totalSize;
  size_t align;
  char **in_stack_ffffffffffffff58;
  Cdr *in_stack_ffffffffffffff60;
  Cdr *in_stack_ffffffffffffff70;
  _FastBuffer_iterator local_80;
  _FastBuffer_iterator local_70;
  _FastBuffer_iterator in_stack_ffffffffffffffa0;
  _FastBuffer_iterator local_50;
  char *local_40;
  char *local_38;
  ulong local_30;
  size_t local_28;
  size_t local_20;
  long local_18;
  char local_10 [16];
  
  local_18 = in_RDX;
  local_20 = alignment(in_stack_ffffffffffffff70,(size_t)in_RDI);
  local_28 = local_18 * 4;
  local_30 = local_28 + local_20;
  sVar2 = _FastBuffer_iterator::operator-(&in_RDI->m_lastPosition,&in_RDI->m_currentPosition);
  if ((sVar2 < local_30) &&
     (bVar1 = resize((Cdr *)in_stack_ffffffffffffffa0.m_currentPosition,
                     (size_t)in_stack_ffffffffffffffa0.m_buffer), !bVar1)) {
    this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
    exception::NotEnoughMemoryException::NotEnoughMemoryException(this_00,in_stack_ffffffffffffff58)
    ;
    __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                exception::NotEnoughMemoryException::~NotEnoughMemoryException);
  }
  in_RDI->m_lastDataSize = 4;
  if (local_18 != 0) {
    makeAlign(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
  }
  if ((in_RDI->m_swapBytes & 1U) == 0) {
    _FastBuffer_iterator::memcopy
              ((_FastBuffer_iterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x10c466)
    ;
    _FastBuffer_iterator::operator+=(&in_RDI->m_currentPosition,local_28);
  }
  else {
    local_38 = local_10;
    local_40 = local_38 + local_28;
    for (; local_38 < local_40; local_38 = local_38 + 4) {
      local_50 = _FastBuffer_iterator::operator++
                           ((_FastBuffer_iterator *)in_RDI,
                            (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      _FastBuffer_iterator::operator<<(&local_50,local_38 + 3);
      _FastBuffer_iterator::operator++
                ((_FastBuffer_iterator *)in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      _FastBuffer_iterator::operator<<
                ((_FastBuffer_iterator *)&stack0xffffffffffffffa0,local_38 + 2);
      local_70 = _FastBuffer_iterator::operator++
                           ((_FastBuffer_iterator *)in_RDI,
                            (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      _FastBuffer_iterator::operator<<(&local_70,local_38 + 1);
      local_80 = _FastBuffer_iterator::operator++
                           ((_FastBuffer_iterator *)in_RDI,
                            (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      _FastBuffer_iterator::operator<<(&local_80,local_38);
    }
  }
  return in_RDI;
}

Assistant:

Cdr& Cdr::serializeArray(const int32_t *long_t, size_t numElements)
{
    size_t align = alignment(sizeof(*long_t));
    size_t totalSize = sizeof(*long_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*long_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&long_t);
            const char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*long_t))
            {
                m_currentPosition++ << dst[3];
                m_currentPosition++ << dst[2];
                m_currentPosition++ << dst[1];
                m_currentPosition++ << dst[0];
            }
        }
        else
        {
            m_currentPosition.memcopy(long_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}